

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>_> __thiscall
wabt::MakeUnique<wabt::TableCopyExpr,wabt::Var,wabt::Var>(wabt *this,Var *args,Var *args_1)

{
  Var *src;
  Var *dst;
  TableCopyExpr *this_00;
  Location local_40;
  Var *local_20;
  Var *args_local_1;
  Var *args_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (Var *)this;
  this_00 = (TableCopyExpr *)operator_new(0xd0);
  dst = args_local_1;
  src = local_20;
  Location::Location(&local_40);
  TableCopyExpr::TableCopyExpr(this_00,dst,src,&local_40);
  std::unique_ptr<wabt::TableCopyExpr,std::default_delete<wabt::TableCopyExpr>>::
  unique_ptr<std::default_delete<wabt::TableCopyExpr>,void>
            ((unique_ptr<wabt::TableCopyExpr,std::default_delete<wabt::TableCopyExpr>> *)this,
             this_00);
  return (__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
         )(__uniq_ptr_data<wabt::TableCopyExpr,_std::default_delete<wabt::TableCopyExpr>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}